

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

shared_ptr<wallet::CWallet>
wallet::CreateWallet
          (WalletContext *context,string *name,optional<bool> load_on_start,DatabaseOptions *options
          ,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  optional<bool> load_on_startup;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference ppSVar4;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  string *in_RSI;
  element_type *in_RDI;
  long in_R8;
  undefined4 *in_R9;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar6;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_00000008;
  bilingual_str *in_stack_00000010;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range5;
  bool create_blank;
  ArgsManager *args;
  SecureString *passphrase;
  uint64_t wallet_creation_flags;
  iterator __end5;
  iterator __begin5;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  bilingual_str *in_stack_fffffffffffff898;
  bilingual_str *this;
  CWallet *in_stack_fffffffffffff8a0;
  undefined7 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8af;
  bilingual_str *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  undefined6 in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8c6;
  undefined1 in_stack_fffffffffffff8c7;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffff8c8;
  CWallet *in_stack_fffffffffffff8d0;
  string *original;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  DatabaseOptions *in_stack_fffffffffffff8e0;
  char *__s;
  undefined6 in_stack_fffffffffffff8e8;
  _Storage<bool,_true> in_stack_fffffffffffff8ee;
  undefined1 in_stack_fffffffffffff8ef;
  CWallet *in_stack_fffffffffffff8f0;
  CWallet *this_00;
  int local_66c;
  bilingual_str *local_648;
  undefined4 in_stack_fffffffffffff9e8;
  undefined2 in_stack_fffffffffffff9ec;
  undefined2 in_stack_fffffffffffff9ee;
  CWallet *in_stack_fffffffffffff9f0;
  undefined1 local_5fc [2];
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  undefined1 local_5f8 [30];
  allocator<char> local_5da;
  allocator<char> local_5d9;
  CWallet *in_stack_fffffffffffffa28;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  undefined4 local_5c8;
  allocator<char> local_5c1;
  undefined4 local_5c0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined1 local_2a8 [672];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_648 = *(bilingual_str **)(in_R8 + 0x10);
  inline_assertion_check<true,ArgsManager*&>
            ((ArgsManager **)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             (char *)in_stack_fffffffffffff8d0,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffff8c7,
                              CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)),
             in_stack_fffffffffffff8b8);
  if (((ulong)local_648 & 0x400000000) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    bVar1 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffff8a0,&in_stack_fffffffffffff898->original
                       ,(bool)in_stack_fffffffffffff8af);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5c1);
    if (bVar1) {
      local_5c8 = 3;
      std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
                ((optional<wallet::DatabaseFormat> *)
                 CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                 (DatabaseFormat *)in_stack_fffffffffffff8a0);
      *(undefined8 *)(in_R8 + 4) = local_5a8;
    }
  }
  else {
    local_5c0 = 1;
    std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
              ((optional<wallet::DatabaseFormat> *)
               CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
               (DatabaseFormat *)in_stack_fffffffffffff8a0);
    *(undefined8 *)(in_R8 + 4) = local_5a0;
  }
  uVar3 = (ulong)local_648 & 0x200000000;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                     in_stack_fffffffffffff898);
  if (!bVar1) {
    local_648 = (bilingual_str *)((ulong)local_648 | 0x200000000);
  }
  if ((((ulong)local_648 & 0x800000000) != 0) && (((ulong)local_648 & 0x100000000) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    Untranslated((string *)in_stack_fffffffffffff8d0);
    bilingual_str::operator=
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
               (bilingual_str *)in_stack_fffffffffffff8a0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5c9);
    *in_R9 = 6;
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff898,(nullptr_t)0xacae81);
    _Var5._M_pi = extraout_RDX;
    goto LAB_00acbf2e;
  }
  if ((((ulong)local_648 & 0x800000000) != 0) && (((ulong)local_648 & 0x400000000) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    Untranslated((string *)in_stack_fffffffffffff8d0);
    bilingual_str::operator=
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
               (bilingual_str *)in_stack_fffffffffffff8a0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5ca);
    *in_R9 = 6;
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff898,(nullptr_t)0xacafb4);
    _Var5._M_pi = extraout_RDX_00;
    goto LAB_00acbf2e;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                     in_stack_fffffffffffff898);
  if ((!bVar1) && (((ulong)local_648 & 0x100000000) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    Untranslated((string *)in_stack_fffffffffffff8d0);
    bilingual_str::operator=
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
               (bilingual_str *)in_stack_fffffffffffff8a0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5cb);
    *in_R9 = 6;
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff898,(nullptr_t)0xacb0e0);
    _Var5._M_pi = extraout_RDX_01;
    goto LAB_00acbf2e;
  }
  MakeWalletDatabase((string *)
                     CONCAT17(in_stack_fffffffffffff8ef,
                              CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)
                             ),in_stack_fffffffffffff8e0,
                     (DatabaseStatus *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8)
                     ,(bilingual_str *)in_stack_fffffffffffff8d0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)in_stack_fffffffffffff898);
  if (bVar1) {
    this_00 = (CWallet *)(in_RSI->_M_dataplus)._M_p;
    str.lit._6_1_ = in_stack_fffffffffffff8ee._M_value;
    str.lit._0_6_ = in_stack_fffffffffffff8e8;
    str.lit._7_1_ = in_stack_fffffffffffff8ef;
    ::_(str);
    (*(this_00->super_WalletStorage)._vptr_WalletStorage[0x25])(this_00,local_2a8);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
    unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               in_stack_fffffffffffff898,
               (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               0xacb48e);
    CWallet::Create((WalletContext *)(local_5f8 + 8),in_RSI,in_RDX,(uint64_t)local_5f8,local_648,
                    in_stack_00000008);
    _GLOBAL__N_1::std::
    unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
              ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                       in_stack_00000010);
    if (bVar1) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                    in_stack_00000010);
      this = in_stack_00000010;
      if ((!bVar1) && (((ulong)local_648 & 0x100000000) == 0)) {
        _GLOBAL__N_1::std::
        __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_00000010);
        in_stack_fffffffffffff8ef =
             CWallet::EncryptWallet
                       (in_stack_fffffffffffff9f0,
                        (SecureString *)
                        CONCAT26(in_stack_fffffffffffff9ee,
                                 CONCAT24(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)));
        if (!(bool)in_stack_fffffffffffff8ef) {
          __s = local_5fc + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff8ef,
                              CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)
                             ),__s,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
          Untranslated((string *)in_stack_fffffffffffff8d0);
          bilingual_str::operator=
                    ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                     (bilingual_str *)in_stack_fffffffffffff8a0);
          bilingual_str::~bilingual_str(in_stack_00000010);
          std::__cxx11::string::~string(&in_stack_00000010->original);
          std::allocator<char>::~allocator((allocator<char> *)(local_5fc + 1));
          *in_R9 = 9;
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_00000010,(nullptr_t)0xacb8d0);
          this = in_stack_00000010;
          goto LAB_00acbef2;
        }
        this = in_stack_00000010;
        if (uVar3 != 0) goto LAB_00acbdb0;
        _GLOBAL__N_1::std::
        __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_00000010);
        in_stack_fffffffffffff8df =
             CWallet::Unlock(in_stack_fffffffffffff8f0,
                             (SecureString *)
                             CONCAT17(in_stack_fffffffffffff8ef,
                                      CONCAT16(in_stack_fffffffffffff8ee._M_value,
                                               in_stack_fffffffffffff8e8)));
        if (!(bool)in_stack_fffffffffffff8df) {
          original = (string *)local_5fc;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff8ef,
                              CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)
                             ),&in_stack_fffffffffffff8e0->require_existing,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
          Untranslated(original);
          bilingual_str::operator=
                    ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                     (bilingual_str *)in_stack_fffffffffffff8a0);
          bilingual_str::~bilingual_str(in_stack_00000010);
          std::__cxx11::string::~string(&in_stack_00000010->original);
          std::allocator<char>::~allocator((allocator<char> *)local_5fc);
          *in_R9 = 9;
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_00000010,(nullptr_t)0xacba2c);
          this = in_stack_00000010;
          goto LAB_00acbef2;
        }
        _GLOBAL__N_1::std::
        __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_00000010);
        in_stack_fffffffffffff8c8 =
             MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                       ((AnnotatedMixin<std::recursive_mutex> *)in_stack_00000010);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff8d0,
                   (char *)in_stack_fffffffffffff8c8,
                   (char *)CONCAT17(in_stack_fffffffffffff8c7,
                                    CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)),
                   (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x18,0));
        _GLOBAL__N_1::std::
        __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_00000010);
        bVar1 = CWallet::IsWalletFlagSet
                          ((CWallet *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                           (uint64_t)in_stack_fffffffffffff8a0);
        if (bVar1) {
          _GLOBAL__N_1::std::
          __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_00000010);
          CWallet::SetupDescriptorScriptPubKeyMans(in_stack_fffffffffffffa28);
          this = in_stack_00000010;
LAB_00acbd5a:
          local_66c = 0;
        }
        else {
          _GLOBAL__N_1::std::
          __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_00000010);
          CWallet::GetActiveScriptPubKeyMans(this_00);
          std::
          set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)in_stack_fffffffffffff8a0);
          std::
          set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 *)in_stack_fffffffffffff8a0);
          this = in_stack_00000010;
          while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff8af,
                                                           in_stack_fffffffffffff8a8),
                                         (_Self *)in_stack_fffffffffffff8a0),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            ppSVar4 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                                ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)this);
            uVar2 = (*(*ppSVar4)->_vptr_ScriptPubKeyMan[0xb])(*ppSVar4,0);
            if ((uVar2 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff8ef,
                                  CONCAT16(in_stack_fffffffffffff8ee._M_value,
                                           in_stack_fffffffffffff8e8)),
                         &in_stack_fffffffffffff8e0->require_existing,
                         (allocator<char> *)
                         CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
              Untranslated((string *)in_stack_fffffffffffff8d0);
              bilingual_str::operator=
                        ((bilingual_str *)
                         CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                         (bilingual_str *)in_stack_fffffffffffff8a0);
              bilingual_str::~bilingual_str(this);
              std::__cxx11::string::~string(&this->original);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9ef);
              *in_R9 = 6;
              std::shared_ptr<wallet::CWallet>::shared_ptr
                        ((shared_ptr<wallet::CWallet> *)this,(nullptr_t)0xacbca5);
              local_66c = 1;
              goto LAB_00acbd2e;
            }
            std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                      ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)this);
          }
          local_66c = 2;
LAB_00acbd2e:
          std::
          set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)this);
          if (local_66c == 2) goto LAB_00acbd5a;
        }
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this);
        if (local_66c != 0) goto LAB_00acbef2;
        _GLOBAL__N_1::std::
        __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )this);
        CWallet::Lock(in_stack_fffffffffffff8d0);
      }
LAB_00acbdb0:
      NotifyWalletLoaded((WalletContext *)in_stack_fffffffffffff8d0,
                         (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff8c8);
      AddWallet((WalletContext *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff8d0);
      _GLOBAL__N_1::std::
      __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this);
      CWallet::postInitProcess(in_stack_fffffffffffff8a0);
      load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged = (bool)in_stack_fffffffffffff8ef;
      load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_payload._M_value = in_stack_fffffffffffff8ee._M_value;
      UpdateWalletSetting((Chain *)in_stack_fffffffffffff8e0,
                          (string *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          load_on_startup,
                          (vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                          in_stack_fffffffffffff8d0);
      if (((ulong)local_648 & 0x400000000) == 0) {
        str_00.lit._6_1_ = in_stack_fffffffffffff8ee._M_value;
        str_00.lit._0_6_ = in_stack_fffffffffffff8e8;
        str_00.lit._7_1_ = in_stack_fffffffffffff8ef;
        ::_(str_00);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                  ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)this,
                   (value_type *)0xacbe8c);
        bilingual_str::~bilingual_str(this);
      }
      *in_R9 = 0;
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)this,(shared_ptr<wallet::CWallet> *)0xacbee7);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff8ef,
                          CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
                 &in_stack_fffffffffffff8e0->require_existing,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      Untranslated((string *)in_stack_fffffffffffff8d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff8ef,
                          CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
                 &in_stack_fffffffffffff8e0->require_existing,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      Untranslated((string *)in_stack_fffffffffffff8d0);
      ::operator+(in_stack_fffffffffffff8b0,
                  (bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
      ::operator+(in_stack_fffffffffffff8b0,
                  (bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
      bilingual_str::operator=
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
                 (bilingual_str *)in_stack_fffffffffffff8a0);
      bilingual_str::~bilingual_str(in_stack_00000010);
      bilingual_str::~bilingual_str(in_stack_00000010);
      bilingual_str::~bilingual_str(in_stack_00000010);
      std::__cxx11::string::~string(&in_stack_00000010->original);
      std::allocator<char>::~allocator(&local_5fa);
      bilingual_str::~bilingual_str(in_stack_00000010);
      std::__cxx11::string::~string(&in_stack_00000010->original);
      std::allocator<char>::~allocator(&local_5f9);
      *in_R9 = 6;
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_00000010,(nullptr_t)0xacb64e);
      this = in_stack_00000010;
    }
LAB_00acbef2:
    _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::~shared_ptr((shared_ptr<wallet::CWallet> *)this)
    ;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    Untranslated((string *)in_stack_fffffffffffff8d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8ef,
                        CONCAT16(in_stack_fffffffffffff8ee._M_value,in_stack_fffffffffffff8e8)),
               &in_stack_fffffffffffff8e0->require_existing,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    Untranslated((string *)in_stack_fffffffffffff8d0);
    ::operator+(in_stack_fffffffffffff8b0,
                (bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
    ::operator+(in_stack_fffffffffffff8b0,
                (bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
    bilingual_str::operator=
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8),
               (bilingual_str *)in_stack_fffffffffffff8a0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5da);
    bilingual_str::~bilingual_str(in_stack_fffffffffffff898);
    std::__cxx11::string::~string(&in_stack_fffffffffffff898->original);
    std::allocator<char>::~allocator(&local_5d9);
    *in_R9 = 8;
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff898,(nullptr_t)0xacb2e6);
  }
  _GLOBAL__N_1::std::
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
  _Var5._M_pi = extraout_RDX_02;
LAB_00acbf2e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<wallet::CWallet>)
         sVar6.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> CreateWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    uint64_t wallet_creation_flags = options.create_flags;
    const SecureString& passphrase = options.create_passphrase;

    ArgsManager& args = *Assert(context.args);

    if (wallet_creation_flags & WALLET_FLAG_DESCRIPTORS) options.require_format = DatabaseFormat::SQLITE;
    else if (args.GetBoolArg("-swapbdbendian", false)) {
        options.require_format = DatabaseFormat::BERKELEY_SWAP;
    }

    // Indicate that the wallet is actually supposed to be blank and not just blank to make it encrypted
    bool create_blank = (wallet_creation_flags & WALLET_FLAG_BLANK_WALLET);

    // Born encrypted wallets need to be created blank first.
    if (!passphrase.empty()) {
        wallet_creation_flags |= WALLET_FLAG_BLANK_WALLET;
    }

    // Private keys must be disabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Private keys must be disabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Descriptor support must be enabled for an external signer wallet
    if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) && !(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        error = Untranslated("Descriptor support must be enabled when using an external signer");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Do not allow a passphrase when private keys are disabled
    if (!passphrase.empty() && (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        error = Untranslated("Passphrase provided but private keys are disabled. A passphrase is only used to encrypt private keys, so cannot be used for wallets with private keys disabled.");
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Wallet::Verify will check if we're trying to create a wallet with a duplicate name.
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
    if (!database) {
        error = Untranslated("Wallet file verification failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_VERIFY;
        return nullptr;
    }

    // Make the wallet
    context.chain->initMessage(_("Loading wallet…").translated);
    std::shared_ptr<CWallet> wallet = CWallet::Create(context, name, std::move(database), wallet_creation_flags, error, warnings);
    if (!wallet) {
        error = Untranslated("Wallet creation failed.") + Untranslated(" ") + error;
        status = DatabaseStatus::FAILED_CREATE;
        return nullptr;
    }

    // Encrypt the wallet
    if (!passphrase.empty() && !(wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        if (!wallet->EncryptWallet(passphrase)) {
            error = Untranslated("Error: Wallet created but failed to encrypt.");
            status = DatabaseStatus::FAILED_ENCRYPT;
            return nullptr;
        }
        if (!create_blank) {
            // Unlock the wallet
            if (!wallet->Unlock(passphrase)) {
                error = Untranslated("Error: Wallet was encrypted but could not be unlocked");
                status = DatabaseStatus::FAILED_ENCRYPT;
                return nullptr;
            }

            // Set a seed for the wallet
            {
                LOCK(wallet->cs_wallet);
                if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                    wallet->SetupDescriptorScriptPubKeyMans();
                } else {
                    for (auto spk_man : wallet->GetActiveScriptPubKeyMans()) {
                        if (!spk_man->SetupGeneration()) {
                            error = Untranslated("Unable to generate initial keys");
                            status = DatabaseStatus::FAILED_CREATE;
                            return nullptr;
                        }
                    }
                }
            }

            // Relock the wallet
            wallet->Lock();
        }
    }

    NotifyWalletLoaded(context, wallet);
    AddWallet(context, wallet);
    wallet->postInitProcess();

    // Write the wallet settings
    UpdateWalletSetting(*context.chain, name, load_on_start, warnings);

    // Legacy wallets are being deprecated, warn if a newly created wallet is legacy
    if (!(wallet_creation_flags & WALLET_FLAG_DESCRIPTORS)) {
        warnings.push_back(_("Wallet created successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future."));
    }

    status = DatabaseStatus::SUCCESS;
    return wallet;
}